

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Win_allocate_shared
              (MPIABI_Aint size,int disp_unit,MPIABI_Info info,MPIABI_Comm comm,void *baseptr,
              MPIABI_Win *win)

{
  int iVar1;
  
  iVar1 = MPI_Win_allocate_shared();
  return iVar1;
}

Assistant:

int MPIABI_Win_allocate_shared(
  MPIABI_Aint size,
  int disp_unit,
  MPIABI_Info info,
  MPIABI_Comm comm,
  void * baseptr,
  MPIABI_Win * win
) {
  return MPI_Win_allocate_shared(
    (MPI_Aint)(WPI_Aint)size,
    disp_unit,
    (MPI_Info)(WPI_Info)info,
    (MPI_Comm)(WPI_Comm)comm,
    baseptr,
    (MPI_Win *)(WPI_WinPtr)win
  );
}